

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::emit_sample_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  uint index;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  ComponentType element_type;
  Id IVar4;
  ValueKind VVar5;
  Id IVar6;
  Dim DVar7;
  Op OVar8;
  Id IVar9;
  Value *pVVar10;
  mapped_type *pmVar11;
  Builder *pBVar12;
  Operation *pOVar13;
  Operation *pOVar14;
  Operation *pOVar15;
  Operation *this;
  Type *pTVar16;
  byte bVar17;
  char cVar18;
  uint uVar19;
  undefined8 unaff_R12;
  ulong uVar20;
  undefined4 uVar21;
  Op OVar22;
  Op op;
  undefined8 unaff_R13;
  ulong uVar23;
  uint32_t image_ops;
  uint num_coords;
  ComponentType tmp;
  uint num_coords_full;
  Id image_id;
  Id coord [4];
  Id loaded_id;
  Id offsets [3];
  undefined1 in_stack_fffffffffffffef8;
  Id local_100;
  uint32_t local_fc;
  Operation *local_f8;
  uint local_ec;
  Builder *local_e8;
  undefined4 local_dc;
  uint32_t local_d8;
  ComponentType local_d1;
  Id local_d0;
  uint32_t local_cc;
  mapped_type *local_c8;
  Id local_bc;
  Id local_b8;
  Id local_b4;
  Id local_b0;
  Op local_ac;
  uint local_a8;
  Id local_a4;
  Id local_a0;
  Id local_9c;
  Vector<spv::Id> local_98;
  Id local_78 [4];
  Builder *local_68;
  Operation *local_60;
  ValueKind local_54;
  Id local_50 [4];
  ValueKind local_40;
  ValueKind local_3c;
  ValueKind local_38;
  ValueKind local_34;
  
  uVar21 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  if (((1 < opcode - SampleCmp) && (opcode != SampleCmpLevel)) && (opcode != SampleCmpBias)) {
    uVar21 = 0;
  }
  bVar3 = (impl->execution_mode_meta).synthesize_dummy_derivatives;
  if ((SUB41(uVar21,0) == false) &&
     (bVar2 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction), !bVar2)) {
    return true;
  }
  local_f8 = (Operation *)
             CONCAT44(local_f8._4_4_,(int)CONCAT71((int7)((ulong)unaff_R12 >> 8),bVar3));
  local_e8 = Converter::Impl::builder(impl);
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_9c = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  local_a0 = Converter::Impl::build_sampled_image(impl,local_9c,IVar4,SUB41(uVar21,0));
  local_c8 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&local_9c);
  local_cc = 0;
  local_d8 = 0;
  bVar3 = get_image_dimensions(impl,local_9c,&local_cc,&local_d8);
  if (!bVar3) {
    return false;
  }
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  uVar20 = (ulong)local_cc;
  local_dc = uVar21;
  if (uVar20 != 0) {
    uVar23 = 0;
    do {
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar23 + 3);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      local_78[uVar23] = IVar4;
      uVar23 = uVar23 + 1;
    } while (uVar20 != uVar23);
  }
  local_fc = 0;
  OVar22 = opcode;
  cVar18 = (char)local_f8;
  if ((((char)local_f8 != '\0') && (OVar22 = SampleLevel, (opcode & ~TempRegStore) != Sample)) &&
     ((OVar22 = SampleCmpLevelZero, opcode != SampleCmp && (opcode != SampleCmpBias)))) {
    cVar18 = '\0';
    OVar22 = opcode;
  }
  uVar19 = OVar22 - Sample;
  if (((uVar19 < 5) && ((0x13U >> (uVar19 & 0x1f) & 1) != 0)) || (OVar22 == SampleCmpBias)) {
    emit_expect_assume_quad_uniform(impl);
  }
  if ((int)OVar22 < 0x41) {
    if (OVar22 == SampleBias) {
LAB_0016ef72:
      local_fc = 1;
    }
    else if (OVar22 == SampleLevel) goto LAB_0016ef68;
  }
  else {
    if (OVar22 != SampleCmpLevelZero) {
      if (OVar22 == SampleCmpBias) goto LAB_0016ef72;
      if (OVar22 != SampleCmpLevel) goto LAB_0016ef7a;
    }
LAB_0016ef68:
    local_fc = 2;
  }
LAB_0016ef7a:
  local_50[2] = 0;
  local_50[0] = 0;
  local_50[1] = 0;
  local_f8 = (Operation *)(ulong)uVar19;
  get_texel_offsets(impl,instruction,&local_fc,7,local_d8,local_50,(bool)in_stack_fffffffffffffef8);
  local_a4 = 0;
  uVar19 = 10;
  if ((char)local_dc != '\0') {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,10);
    local_a4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    uVar19 = 0xb;
  }
  index = (OVar22 == SampleCmpBias) + 0xb;
  if (OVar22 == Sample) {
    index = 10;
  }
  local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)instruction;
  pmVar11 = std::__detail::
            _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->llvm_composite_meta,(key_type *)&local_98);
  local_ec = pmVar11->access_mask;
  if ((local_ec & 0x10) != 0) {
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_98.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x29);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_e8->capabilities,(Capability *)&local_98);
  }
  local_d0 = 0;
  if ((((uint)local_f8 < 5) && ((0x13U >> ((uint)local_f8 & 0x1f) & 1) != 0)) ||
     (OVar22 == SampleCmpBias)) {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
    pVVar10 = LLVMBC::Internal::resolve_proxy(pVVar10);
    VVar5 = LLVMBC::Value::get_value_kind(pVVar10);
    if (VVar5 != Undef) {
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      local_d0 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      local_fc = local_fc | 0x80;
      local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_98.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2a);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&local_e8->capabilities,(Capability *)&local_98);
    }
  }
  pOVar13 = local_f8;
  if (cVar18 == '\0') {
    if (((OVar22 - SampleBias < 2) || (OVar22 == SampleCmpBias)) || (OVar22 == SampleCmpLevel)) {
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar19);
      local_100 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    }
    else {
      local_100 = spv::Builder::makeFloatConstant(local_e8,0.0,false);
    }
  }
  else {
    local_100 = spv::Builder::makeFloatConstant(local_e8,0.0,false);
    pOVar13 = local_f8;
  }
  IVar4 = local_9c;
  uVar19 = local_ec;
  if (((cVar18 == '\0') && (OVar22 == SampleLevel)) &&
     (((impl->options).quirks.assume_broken_sub_8x8_cube_mips & 1U) != 0)) {
    pBVar12 = Converter::Impl::builder(impl);
    IVar6 = Converter::Impl::get_type_id(impl,IVar4);
    DVar7 = spv::Builder::getTypeDimensionality(pBVar12,IVar6);
    pOVar13 = local_f8;
    if (DVar7 == DimCube) {
      IVar6 = spv::Builder::makeIntegerType(pBVar12,0x20,true);
      pOVar13 = Converter::Impl::allocate(impl,OpImageQueryLevels,IVar6);
      Operation::add_id(pOVar13,IVar4);
      Converter::Impl::add(impl,pOVar13,false);
      IVar4 = spv::Builder::makeIntegerType(pBVar12,0x20,true);
      pOVar14 = Converter::Impl::allocate(impl,OpISub,IVar4);
      Operation::add_id(pOVar14,pOVar13->id);
      IVar4 = spv::Builder::makeIntegerType(pBVar12,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar12,IVar4,4,false);
      Operation::add_id(pOVar14,IVar4);
      Converter::Impl::add(impl,pOVar14,false);
      IVar4 = spv::Builder::makeFloatType(pBVar12,0x20);
      pOVar13 = Converter::Impl::allocate(impl,OpConvertSToF,IVar4);
      Operation::add_id(pOVar13,pOVar14->id);
      Converter::Impl::add(impl,pOVar13,false);
      if (impl->glsl_std450_ext == 0) {
        IVar4 = spv::Builder::import(pBVar12,"GLSL.std.450");
        impl->glsl_std450_ext = IVar4;
      }
      IVar4 = spv::Builder::makeFloatType(pBVar12,0x20);
      pOVar14 = Converter::Impl::allocate(impl,OpExtInst,IVar4);
      Operation::add_id(pOVar14,impl->glsl_std450_ext);
      Operation::add_literal(pOVar14,0x25);
      Operation::add_id(pOVar14,pOVar13->id);
      Operation::add_id(pOVar14,local_100);
      Converter::Impl::add(impl,pOVar14,false);
      local_100 = pOVar14->id;
      pOVar13 = local_f8;
      uVar19 = local_ec;
    }
  }
  bVar3 = false;
  if ((uint)pOVar13 < 6) {
    switch((long)&switchD_0016f2f8::switchdataD_001c7440 +
           (long)(int)(&switchD_0016f2f8::switchdataD_001c7440)[(long)pOVar13]) {
    case 0x16f2fa:
      bVar3 = (uVar19 & 0x10) == 0;
      OVar8 = OpImageSampleImplicitLod;
      op = OpImageSparseSampleImplicitLod;
      break;
    case 0x16f321:
      goto switchD_0016f2f8_caseD_16f321;
    case 0x16f332:
switchD_0016f2f8_caseD_16f332:
      bVar3 = (uVar19 & 0x10) == 0;
      OVar8 = OpImageSampleDrefExplicitLod;
      op = OpImageSparseSampleDrefExplicitLod;
      break;
    case 0x16f343:
      bVar3 = (uVar19 & 0x10) == 0;
      OVar8 = OpImageSampleExplicitLod;
      op = OpImageSparseSampleExplicitLod;
      break;
    case 0x16f9ef:
      goto switchD_0016f2f8_caseD_16f9ef;
    }
  }
  else {
    if (OVar22 == SampleCmpLevel) goto switchD_0016f2f8_caseD_16f332;
    if (OVar22 != SampleCmpBias) {
      return false;
    }
switchD_0016f2f8_caseD_16f321:
    bVar3 = (uVar19 & 0x10) == 0;
    OVar8 = OpImageSampleDrefImplicitLod;
    op = OpImageSparseSampleDrefImplicitLod;
  }
  if (bVar3) {
    op = OVar8;
  }
  element_type = Converter::Impl::get_effective_typed_resource_type(local_c8->component_type);
  bVar17 = (byte)local_dc ^ 1;
  local_a8 = (uint)bVar17 + (uint)bVar17 * 2 + 1;
  IVar4 = Converter::Impl::get_type_id(impl,element_type,1,local_a8,false);
  if ((uVar19 & 0x10) != 0) {
    IVar6 = spv::Builder::makeIntegerType(local_e8,0x20,false);
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         &(((CallInst *)
           local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.kind;
    *(Id *)&(((CallInst *)
             local_98.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start)->super_Instruction).super_Value.type = IVar6;
    *(Id *)((long)&(((CallInst *)
                    local_98.
                    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.type +
           4) = IVar4;
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    IVar4 = Converter::Impl::get_struct_type(impl,&local_98,0,"SparseTexel");
    uVar19 = local_ec;
    if ((CallInst *)
        local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (CallInst *)0x0) {
      free_in_thread(local_98.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      uVar19 = local_ec;
    }
  }
  uVar1 = local_d8;
  bVar17 = ((impl->options).compute_shader_derivatives ^ 1U) &
           impl->execution_model != ExecutionModelFragment;
  if (bVar17 == 1) {
    bVar17 = 1;
    if (op < OpImageSparseSampleImplicitLod) {
      if (op == OpImageSampleImplicitLod) {
        op = OpImageSampleExplicitLod;
      }
      else if (op == OpImageSampleDrefImplicitLod) {
        op = OpImageSampleDrefExplicitLod;
      }
      else {
LAB_0016f46c:
        bVar17 = 0;
      }
    }
    else if (op == OpImageSparseSampleDrefImplicitLod) {
      op = OpImageSparseSampleDrefExplicitLod;
    }
    else {
      if (op != OpImageSparseSampleImplicitLod) goto LAB_0016f46c;
      op = OpImageSparseSampleExplicitLod;
    }
  }
  IVar9 = 0;
  IVar6 = 0;
  if (bVar17 != 0) {
    local_b0 = IVar4;
    local_ac = op;
    pBVar12 = Converter::Impl::builder(impl);
    local_bc = spv::Builder::makeFloatType(pBVar12,0x20);
    IVar4 = spv::Builder::makeVectorType(pBVar12,local_bc,uVar1);
    IVar6 = spv::Builder::makeFloatType(pBVar12,0x20);
    IVar6 = Converter::Impl::build_vector(impl,IVar6,local_78,uVar1);
    local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_98.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x44);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar12->capabilities,(Capability *)&local_98);
    pOVar13 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar4);
    IVar9 = spv::Builder::makeIntegerType(pBVar12,0x20,false);
    IVar9 = spv::Builder::makeIntConstant(pBVar12,IVar9,3,false);
    Operation::add_id(pOVar13,IVar9);
    local_f8 = pOVar13;
    local_b4 = IVar6;
    Operation::add_id(pOVar13,IVar6);
    IVar9 = spv::Builder::makeIntegerType(pBVar12,0x20,false);
    IVar9 = spv::Builder::makeIntConstant(pBVar12,IVar9,0,false);
    Operation::add_id(pOVar13,IVar9);
    pOVar13 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar4);
    IVar9 = spv::Builder::makeIntegerType(pBVar12,0x20,false);
    IVar9 = spv::Builder::makeIntConstant(pBVar12,IVar9,3,false);
    Operation::add_id(pOVar13,IVar9);
    local_60 = pOVar13;
    Operation::add_id(pOVar13,IVar6);
    IVar6 = spv::Builder::makeIntegerType(pBVar12,0x20,false);
    local_68 = pBVar12;
    IVar6 = spv::Builder::makeIntConstant(pBVar12,IVar6,1,false);
    Operation::add_id(pOVar13,IVar6);
    pOVar15 = Converter::Impl::allocate(impl,OpFSub,IVar4);
    local_b8 = IVar4;
    this = Converter::Impl::allocate(impl,OpFSub,IVar4);
    IVar4 = local_b4;
    Operation::add_id(pOVar15,local_b4);
    pOVar13 = local_f8;
    Operation::add_id(pOVar15,local_f8->id);
    Operation::add_id(this,IVar4);
    pOVar14 = local_60;
    Operation::add_id(this,local_60->id);
    Converter::Impl::add(impl,pOVar13,false);
    Converter::Impl::add(impl,pOVar14,false);
    Converter::Impl::add(impl,pOVar15,false);
    Converter::Impl::add(impl,this,false);
    IVar6 = pOVar15->id;
    IVar9 = this->id;
    if ((local_fc & 1) != 0) {
      local_f8 = (Operation *)CONCAT44(local_f8._4_4_,IVar6);
      local_fc = local_fc & 0xfffffffe;
      if (impl->glsl_std450_ext == 0) {
        IVar4 = spv::Builder::import(local_68,"GLSL.std.450");
        impl->glsl_std450_ext = IVar4;
      }
      pOVar13 = Converter::Impl::allocate(impl,OpExtInst,local_bc);
      Operation::add_id(pOVar13,impl->glsl_std450_ext);
      Operation::add_literal(pOVar13,0x1d);
      Operation::add_id(pOVar13,local_100);
      Converter::Impl::add(impl,pOVar13,false);
      IVar4 = local_b8;
      pOVar14 = Converter::Impl::allocate(impl,OpVectorTimesScalar,local_b8);
      pOVar15 = Converter::Impl::allocate(impl,OpVectorTimesScalar,IVar4);
      Operation::add_id(pOVar14,(uint)local_f8);
      Operation::add_id(pOVar14,pOVar13->id);
      Operation::add_id(pOVar15,IVar9);
      Operation::add_id(pOVar15,pOVar13->id);
      Converter::Impl::add(impl,pOVar14,false);
      Converter::Impl::add(impl,pOVar15,false);
      IVar6 = pOVar14->id;
      IVar9 = pOVar15->id;
    }
    local_fc = local_fc | 4;
    uVar19 = local_ec;
    IVar4 = local_b0;
    op = local_ac;
  }
  local_f8 = (Operation *)CONCAT44(local_f8._4_4_,IVar6);
  pOVar13 = Converter::Impl::allocate(impl,op,(Value *)instruction,IVar4);
  if ((uVar19 & 0x10) == 0) {
    pTVar16 = LLVMBC::Value::getType((Value *)instruction);
    pTVar16 = LLVMBC::Type::getStructElementType(pTVar16,0);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar16,pOVar13->id,true);
  }
  Operation::add_id(pOVar13,local_a0);
  IVar4 = spv::Builder::makeFloatType(local_e8,0x20);
  IVar4 = Converter::Impl::build_vector(impl,IVar4,local_78,local_cc);
  Operation::add_id(pOVar13,IVar4);
  if (local_a4 != 0) {
    Operation::add_id(pOVar13,local_a4);
  }
  uVar1 = local_fc;
  Operation::add_literal(pOVar13,local_fc);
  if ((uVar1 & 3) != 0) {
    Operation::add_id(pOVar13,local_100);
  }
  if ((uVar1 & 4) != 0) {
    Operation::add_id(pOVar13,(uint)local_f8);
    Operation::add_id(pOVar13,IVar9);
  }
  if ((uVar1 & 0x18) != 0) {
    IVar4 = build_texel_offset_vector(impl,local_50,local_d8,uVar1,false);
    Operation::add_id(pOVar13,IVar4);
  }
  if ((char)uVar1 < '\0') {
    Operation::add_id(pOVar13,local_d0);
  }
  Converter::Impl::add(impl,pOVar13,false);
  pTVar16 = LLVMBC::Value::getType((Value *)instruction);
  pTVar16 = LLVMBC::Type::getStructElementType(pTVar16,0);
  if ((local_ec & 0x10) == 0) {
    if ((char)local_dc == '\0') {
      Converter::Impl::fixup_load_type_typed
                (impl,local_c8->component_type,4,(Value *)instruction,pTVar16);
    }
    else {
      local_54 = pOVar13->id;
      local_d1 = local_c8->component_type;
      Converter::Impl::fixup_load_type_typed(impl,&local_d1,1,&local_54,pTVar16);
      IVar4 = Converter::Impl::get_type_id(impl,pTVar16,0);
      IVar4 = spv::Builder::makeVectorType(local_e8,IVar4,4);
      pOVar13 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar4);
      local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = &stack0xffffffffffffffc0;
      local_40 = local_54;
      local_3c = local_54;
      local_38 = local_54;
      local_34 = local_54;
      local_98.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (ValueKind *)0x4;
      Operation::add_ids(pOVar13,(initializer_list<unsigned_int> *)&local_98);
      Converter::Impl::add(impl,pOVar13,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar13->id);
    }
  }
  else {
    Converter::Impl::repack_sparse_feedback
              (impl,local_c8->component_type,local_a8,(Value *)instruction,pTVar16,0);
  }
  build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
  bVar3 = true;
switchD_0016f2f8_caseD_16f9ef:
  return bVar3;
}

Assistant:

bool emit_sample_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmp ||
	                           opcode == DXIL::Op::SampleCmpLevelZero ||
	                           opcode == DXIL::Op::SampleCmpLevel ||
	                           opcode == DXIL::Op::SampleCmpBias;

	bool force_explicit_lod = impl.execution_mode_meta.synthesize_dummy_derivatives;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	uint32_t image_ops = 0;

	if (force_explicit_lod)
	{
		if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias)
			opcode = DXIL::Op::SampleLevel;
		else if (opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleCmpBias)
			opcode = DXIL::Op::SampleCmpLevelZero;
		else
			force_explicit_lod = false;
	}

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias ||
	    opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleCmp)
	{
		emit_expect_assume_quad_uniform(impl);
	}

	if (opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevelZero || opcode == DXIL::Op::SampleCmpLevel)
		image_ops |= spv::ImageOperandsLodMask;
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
		image_ops |= spv::ImageOperandsBiasMask;

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	spv::Id dref_id = 0;

	if (comparison_sampling)
		dref_id = impl.get_id_for_value(instruction->getOperand(10));

	spv::Id bias_level_argument = 0;
	spv::Id min_lod_argument = 0;
	unsigned bias_level_argument_index = comparison_sampling ? 11 : 10;
	unsigned min_lod_argument_index = 11;

	if (opcode == DXIL::Op::Sample)
		min_lod_argument_index = 10;
	else if (opcode == DXIL::Op::SampleCmpBias)
		min_lod_argument_index = 12;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
		{
			min_lod_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
			image_ops |= spv::ImageOperandsMinLodMask;
			builder.addCapability(spv::CapabilityMinLod);
		}
	}

	if (force_explicit_lod)
		bias_level_argument = builder.makeFloatConstant(0.0f);
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevel)
		bias_level_argument = impl.get_id_for_value(instruction->getOperand(bias_level_argument_index));
	else
		bias_level_argument = builder.makeFloatConstant(0.0f);

	if (!force_explicit_lod && impl.options.quirks.assume_broken_sub_8x8_cube_mips && opcode == DXIL::Op::SampleLevel)
		bias_level_argument = emit_workaround_clamp_cube_mips(impl, image_id, bias_level_argument);

	spv::Op spv_op;

	switch (opcode)
	{
	case DXIL::Op::SampleLevel:
		spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
		break;

	case DXIL::Op::Sample:
	case DXIL::Op::SampleBias:
		spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		break;

	case DXIL::Op::SampleCmp:
	case DXIL::Op::SampleCmpBias:
		spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		break;

	case DXIL::Op::SampleCmpLevel:
	case DXIL::Op::SampleCmpLevelZero:
		spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;
		break;

	default:
		return false;
	}

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id grad_x = 0, grad_y = 0;
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	bool grad_rewrite = impl.execution_model != spv::ExecutionModelFragment &&
	                    !impl.options.compute_shader_derivatives;

	if (grad_rewrite)
	{
		switch (spv_op)
		{
		case spv::OpImageSampleImplicitLod:
			spv_op = spv::OpImageSampleExplicitLod;
			break;

		case spv::OpImageSparseSampleImplicitLod:
			spv_op = spv::OpImageSparseSampleExplicitLod;
			break;

		case spv::OpImageSampleDrefImplicitLod:
			spv_op = spv::OpImageSampleDrefExplicitLod;
			break;

		case spv::OpImageSparseSampleDrefImplicitLod:
			spv_op = spv::OpImageSparseSampleDrefExplicitLod;
			break;

		default:
			grad_rewrite = false;
			break;
		}
	}

	if (grad_rewrite)
		build_gradient(impl, coord, num_coords, grad_x, grad_y, bias_level_argument, image_ops);

	// Comparison sampling only returns a scalar, so we'll need to splat out result.
	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & (spv::ImageOperandsBiasMask | spv::ImageOperandsLodMask))
		op->add_id(bias_level_argument);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(grad_x);
		op->add_id(grad_y);
	}

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
	{
		spv::Id offset_vec = build_texel_offset_vector(impl, offsets, num_coords, image_ops, false);
		op->add_id(offset_vec);
	}

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(min_lod_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
	{
		// Repack return arguments from { i32, Tx4 } into { T, T, T, T, i32 } which DXIL expects.
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	}
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
	}

	build_exploded_composite_from_vector(impl, instruction, 4);

	return true;
}